

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string_conflict * __thiscall cs::codecvt::ascii::wide2local(ascii *this,u32string *str)

{
  bool bVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDX;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDI;
  char32_t ch;
  const_iterator __end2;
  const_iterator __begin2;
  u32string *__range2;
  string_conflict local;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffff78;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_58;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_50;
  string local_38 [32];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_38);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
            (local_18);
  std::__cxx11::string::reserve((ulong)local_38);
  local_50 = local_18;
  local_58._M_current =
       (char32_t *)
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       begin(in_stack_ffffffffffffff78);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::end
            (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::operator*(&local_58);
    std::__cxx11::string::push_back((char)local_38);
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::operator++(&local_58);
  }
  std::__cxx11::string::string((string *)in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  return (string_conflict *)this_00;
}

Assistant:

std::string wide2local(const std::u32string &str) override
			{
				std::string local;
				local.reserve(str.size());
				for (auto ch: str)
					local.push_back(ch);
				return std::move(local);
			}